

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O1

void Npn_ManSaveOne(uint *puTruth,int nVars)

{
  int v;
  long lVar1;
  word wVar2;
  ulong uVar3;
  uint uVar4;
  word *pwVar5;
  int Supp;
  uint uVar6;
  
  if (6 < (uint)nVars) {
    __assert_fail("nVars >= 0 && nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcNpnSave.c"
                  ,0x2cd,"void Npn_ManSaveOne(unsigned int *, int)");
  }
  uVar3 = *(ulong *)puTruth;
  if (pNpnMan == (Npn_Man_t *)0x0) {
    Abc_Print(1,"Creating new table with 0 entries.\n");
    pNpnMan = Npn_ManStart((char *)0x0);
  }
  pwVar5 = Truth;
  lVar1 = 0;
  uVar6 = 0;
  do {
    uVar4 = 1 << ((byte)lVar1 & 0x1f);
    if ((*pwVar5 & uVar3) >> ((byte)uVar4 & 0x3f) == (~*pwVar5 & uVar3)) {
      uVar4 = 0;
    }
    uVar6 = uVar6 | uVar4;
    lVar1 = lVar1 + 1;
    pwVar5 = pwVar5 + 1;
  } while (lVar1 != 6);
  if ((uVar6 + 1 & uVar6) != 0) {
    return;
  }
  wVar2 = Npn_TruthPadWord(uVar3,nVars);
  uVar3 = (wVar2 >> 1 & 0x5555555555555555) + (wVar2 & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = (uVar3 >> 4 & 0x707070707070707) + (uVar3 & 0x707070707070707);
  uVar3 = (uVar3 >> 8 & 0xf000f000f000f) + (uVar3 & 0xf000f000f000f);
  lVar1 = (uVar3 >> 0x10 & 0x1f0000001f) + (uVar3 & 0x1f0000001f);
  Npn_ManAdd(pNpnMan,(ulong)((byte)((char)((ulong)lVar1 >> 0x20) + (char)lVar1) < 0x21) - 1 ^ wVar2)
  ;
  return;
}

Assistant:

void Npn_ManSaveOne( unsigned * puTruth, int nVars )
{
    word uTruth = (((word)puTruth[1]) << 32) | (word)puTruth[0];
    assert( nVars >= 0 && nVars <= 6 );
    if ( pNpnMan == NULL )
    {
        Abc_Print( 1, "Creating new table with 0 entries.\n" );
        pNpnMan = Npn_ManStart( NULL );
    }
    // skip truth tables that do not depend on some vars
    if ( !Npn_TruthIsMinBase( uTruth ) )
        return;
    // extend truth table to look like 6-input
    uTruth = Npn_TruthPadWord( uTruth, nVars );
    // semi(!)-NPN-canonize the truth table
    uTruth = Npn_TruthCanon( uTruth, 6, NULL );
    // add to storage
    Npn_ManAdd( pNpnMan, uTruth );
}